

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.hpp
# Opt level: O2

bool __thiscall SymbolTable::hashInsert(SymbolTable *this,Symbol s)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = (s.val._0_4_ & 0xffffff) * -0x4ee6db1f;
  uVar2 = (ulong)(((uVar3 >> 0xf ^ uVar3) & 0x3ff) << 4);
  uVar1 = *(ulong *)((long)&this->hashTab[0].icl + uVar2);
  if (0xf1feffff < uVar1) {
    *(u64 *)((long)&this->hashTab[0].icl + uVar2) = s.icl;
    *(u64 *)((long)&this->hashTab[0].val + uVar2) =
         (s.val.num << ((byte)s.icl & 0x3f)) >> ((byte)s.icl & 0x3f);
  }
  return 0xf1feffff < uVar1;
}

Assistant:

bool hashInsert(Symbol s) {
      u32 idx = s.hash() & (hashTabSize-1);
      bool taken = (hashTab[idx].icl < FSST_ICL_FREE);
      if (taken) return false; // collision in hash table
      hashTab[idx].icl = s.icl;
      hashTab[idx].val.num = s.val.num & (0xFFFFFFFFFFFFFFFF >> (u8) s.icl);
      return true;
   }